

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  int iVar1;
  char *pcVar2;
  long lStack_40;
  allocator local_29;
  char buffer [32];
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    iVar1 = snprintf(buffer,0x20,"%.16g");
    lStack_40 = (long)iVar1;
  }
  else if (NAN(value)) {
    buffer._4_4_ = SUB84(buffer._0_8_,4) & 0xffffff00;
    builtin_strncpy(buffer,"null",4);
    lStack_40 = 4;
  }
  else if (0.0 <= value) {
    builtin_strncpy(buffer,"1e+9999",8);
    lStack_40 = 7;
  }
  else {
    builtin_strncpy(buffer,"-1e+9999",9);
    lStack_40 = 8;
  }
  for (pcVar2 = buffer; pcVar2 < buffer + lStack_40; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == ',') {
      *pcVar2 = '.';
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString(double value) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[32];
  int len = -1;

// Print into the buffer. We need not request the alternative representation
// that always has a decimal point because JSON doesn't distingish the
// concepts of reals and integers.
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with
                                                      // visual studio 2005 to
                                                      // avoid warning.
#if defined(WINCE)
  len = _snprintf(buffer, sizeof(buffer), "%.16g", value);
#else
  len = sprintf_s(buffer, sizeof(buffer), "%.16g", value);
#endif
#else
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), "%.16g", value);
  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
#endif
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}